

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O1

void __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this,btHashKey<btTriIndex> *key,
          btTriIndex *value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  btTriIndex *ptr;
  btHashKey<btTriIndex> *pbVar6;
  int *piVar7;
  btCollisionShape *pbVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  int iVar11;
  btTriIndex *pbVar12;
  long lVar13;
  btHashKey<btTriIndex> *pbVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  
  iVar3 = key->m_uid;
  iVar17 = (this->m_valueArray).m_capacity;
  iVar11 = findIndex(this,key);
  if (iVar11 == -1) {
    iVar11 = (this->m_valueArray).m_size;
    iVar4 = (this->m_valueArray).m_capacity;
    if (iVar11 == iVar4) {
      iVar19 = 1;
      if (iVar11 != 0) {
        iVar19 = iVar11 * 2;
      }
      if (iVar4 < iVar19) {
        if (iVar19 == 0) {
          pbVar12 = (btTriIndex *)0x0;
        }
        else {
          pbVar12 = (btTriIndex *)btAlignedAllocInternal((long)iVar19 << 4,0x10);
        }
        lVar13 = (long)(this->m_valueArray).m_size;
        if (0 < lVar13) {
          lVar16 = 0;
          do {
            puVar1 = (undefined8 *)
                     ((long)&((this->m_valueArray).m_data)->m_PartIdTriangleIndex + lVar16);
            uVar9 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pbVar12->m_PartIdTriangleIndex + lVar16);
            *puVar2 = *puVar1;
            puVar2[1] = uVar9;
            lVar16 = lVar16 + 0x10;
          } while (lVar13 * 0x10 != lVar16);
        }
        ptr = (this->m_valueArray).m_data;
        if (ptr != (btTriIndex *)0x0) {
          if ((this->m_valueArray).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr);
          }
          (this->m_valueArray).m_data = (btTriIndex *)0x0;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = pbVar12;
        (this->m_valueArray).m_capacity = iVar19;
      }
    }
    uVar10 = *(undefined4 *)&value->field_0x4;
    pbVar8 = value->m_childShape;
    pbVar12 = (this->m_valueArray).m_data + (this->m_valueArray).m_size;
    pbVar12->m_PartIdTriangleIndex = value->m_PartIdTriangleIndex;
    *(undefined4 *)&pbVar12->field_0x4 = uVar10;
    pbVar12->m_childShape = pbVar8;
    piVar7 = &(this->m_valueArray).m_size;
    *piVar7 = *piVar7 + 1;
    iVar19 = (this->m_keyArray).m_size;
    iVar5 = (this->m_keyArray).m_capacity;
    if (iVar19 == iVar5) {
      iVar18 = 1;
      if (iVar19 != 0) {
        iVar18 = iVar19 * 2;
      }
      if (iVar5 < iVar18) {
        if (iVar18 == 0) {
          pbVar14 = (btHashKey<btTriIndex> *)0x0;
        }
        else {
          pbVar14 = (btHashKey<btTriIndex> *)btAlignedAllocInternal((long)iVar18 << 2,0x10);
        }
        lVar13 = (long)(this->m_keyArray).m_size;
        if (0 < lVar13) {
          pbVar6 = (this->m_keyArray).m_data;
          lVar16 = 0;
          do {
            pbVar14[lVar16].m_uid = pbVar6[lVar16].m_uid;
            lVar16 = lVar16 + 1;
          } while (lVar13 != lVar16);
        }
        pbVar6 = (this->m_keyArray).m_data;
        if (pbVar6 != (btHashKey<btTriIndex> *)0x0) {
          if ((this->m_keyArray).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar6);
          }
          (this->m_keyArray).m_data = (btHashKey<btTriIndex> *)0x0;
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pbVar14;
        (this->m_keyArray).m_capacity = iVar18;
      }
    }
    (this->m_keyArray).m_data[(this->m_keyArray).m_size].m_uid = key->m_uid;
    piVar7 = &(this->m_keyArray).m_size;
    *piVar7 = *piVar7 + 1;
    if (iVar4 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar15 = ~(key->m_uid << 0xf) + key->m_uid;
      uVar15 = ((int)uVar15 >> 10 ^ uVar15) * 9;
      uVar15 = (int)uVar15 >> 6 ^ uVar15;
      uVar15 = ~(uVar15 << 0xb) + uVar15;
      uVar15 = (int)uVar15 >> 0x10 ^ uVar15;
      iVar17 = (this->m_valueArray).m_capacity;
    }
    else {
      uVar15 = ~(iVar3 << 0xf) + iVar3;
      uVar15 = ((int)uVar15 >> 10 ^ uVar15) * 9;
      uVar15 = (int)uVar15 >> 6 ^ uVar15;
      uVar15 = ~(uVar15 << 0xb) + uVar15;
      uVar15 = (int)uVar15 >> 0x10 ^ uVar15;
    }
    uVar15 = iVar17 - 1U & uVar15;
    piVar7 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar11] = piVar7[(int)uVar15];
    piVar7[(int)uVar15] = iVar11;
  }
  else {
    uVar10 = *(undefined4 *)&value->field_0x4;
    pbVar8 = value->m_childShape;
    pbVar12 = (this->m_valueArray).m_data + iVar11;
    pbVar12->m_PartIdTriangleIndex = value->m_PartIdTriangleIndex;
    *(undefined4 *)&pbVar12->field_0x4 = uVar10;
    pbVar12->m_childShape = pbVar8;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}